

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

int __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
get_strategy_path_type
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,int pathIDWithPathIDOffset,int pathIDOffset,int currentRootNodePreL,
          int currentSubtreeSize)

{
  undefined4 local_2c;
  int pathID;
  int currentSubtreeSize_local;
  int currentRootNodePreL_local;
  int pathIDOffset_local;
  int pathIDWithPathIDOffset_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  if (pathIDWithPathIDOffset < 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (pathIDWithPathIDOffset < 1) {
      pathIDWithPathIDOffset = -pathIDWithPathIDOffset;
    }
    local_2c = pathIDWithPathIDOffset + -1;
    if (pathIDOffset <= local_2c) {
      local_2c = local_2c - pathIDOffset;
    }
    if (local_2c == currentRootNodePreL + currentSubtreeSize + -1) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int APTEDTreeIndex<CostModel, TreeIndex>::get_strategy_path_type(
    int pathIDWithPathIDOffset, int pathIDOffset, int currentRootNodePreL,
    int currentSubtreeSize) {
  // if (Integer.signum(pathIDWithPathIDOffset) == -1) {
  if (pathIDWithPathIDOffset < 0) {
    return 0;
  }
  int pathID = std::abs(pathIDWithPathIDOffset) - 1;
  if (pathID >= pathIDOffset) {
    pathID = pathID - pathIDOffset;
  }
  if (pathID == (currentRootNodePreL + currentSubtreeSize) - 1) {
    return 1;
  }
  return 2;
}